

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetSpecification.cpp
# Opt level: O1

bool Rml::StyleSheetSpecification::RegisterParser(String *parser_name,PropertyParser *parser)

{
  long lVar1;
  Table<true,80ul,std::__cxx11::string,Rml::PropertyParser*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  *pTVar2;
  size_t sVar3;
  type ppPVar4;
  long lVar5;
  
  pTVar2 = instance;
  sVar3 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,Rml::PropertyParser*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>(instance,parser_name);
  lVar5 = sVar3 * 0x28 + *(long *)pTVar2;
  lVar1 = *(long *)(instance + 8);
  if (lVar5 == lVar1) {
    ppPVar4 = robin_hood::detail::
              Table<true,80ul,std::__cxx11::string,Rml::PropertyParser*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              ::doCreateByKey<std::__cxx11::string_const&,Rml::PropertyParser*>
                        (instance,parser_name);
    *ppPVar4 = parser;
  }
  else {
    Log::Message(LT_WARNING,"Parser with name %s already exists!",(parser_name->_M_dataplus)._M_p);
  }
  return lVar5 == lVar1;
}

Assistant:

bool StyleSheetSpecification::RegisterParser(const String& parser_name, PropertyParser* parser)
{
	ParserMap::iterator iterator = instance->parsers.find(parser_name);
	if (iterator != instance->parsers.end())
	{
		Log::Message(Log::LT_WARNING, "Parser with name %s already exists!", parser_name.c_str());
		return false;
	}

	instance->parsers[parser_name] = parser;
	return true;
}